

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O2

char * __thiscall bloaty::Options::_InternalParse(Options *this,char *ptr,ParseContext *ctx)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  int number;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string *s;
  CustomDataSource *msg;
  uint64 uVar3;
  UnknownFieldSet *this_03;
  char *field_name;
  uint uVar4;
  char cVar5;
  char *local_68;
  Options *local_60;
  uint32 tag;
  InternalMetadataWithArena *local_50;
  RepeatedPtrField<bloaty::CustomDataSource> *local_48;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_40;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  
  local_38 = &this->source_map_;
  local_40 = &this->debug_filename_;
  local_48 = &this->custom_data_source_;
  this_00 = &this->data_source_;
  this_01 = &this->base_filename_;
  this_02 = &this->filename_;
  local_50 = &this->_internal_metadata_;
  uVar4 = 0;
  local_68 = ptr;
  local_60 = this;
LAB_00186f10:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_68);
    if (bVar1) goto LAB_0018732b;
    local_68 = google::protobuf::internal::ReadTag(local_68,&tag,0);
    if (local_68 == (char *)0x0) goto LAB_0018734b;
    cVar5 = (char)tag;
    switch(tag >> 3) {
    case 1:
      if (cVar5 == '\n') {
        local_68 = local_68 + -1;
        do {
          local_68 = local_68 + 1;
          pbVar2 = google::protobuf::
                   RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::Add(this_02);
          local_68 = google::protobuf::internal::InlineGreedyStringParserUTF8Verify
                               (pbVar2,local_68,ctx,"bloaty.Options.filename");
          if (local_68 == (char *)0x0) goto LAB_0018734b;
        } while ((local_68 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_68 == '\n'));
        goto LAB_00186f10;
      }
      break;
    case 2:
      if (cVar5 == '\x12') {
        local_68 = local_68 + -1;
        do {
          local_68 = local_68 + 1;
          pbVar2 = google::protobuf::
                   RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::Add(this_01);
          local_68 = google::protobuf::internal::InlineGreedyStringParserUTF8Verify
                               (pbVar2,local_68,ctx,"bloaty.Options.base_filename");
          if (local_68 == (char *)0x0) goto LAB_0018734b;
        } while ((local_68 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_68 == '\x12'));
        goto LAB_00186f10;
      }
      break;
    case 3:
      if (cVar5 == '\x1a') {
        local_68 = local_68 + -1;
        do {
          local_68 = local_68 + 1;
          pbVar2 = google::protobuf::
                   RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::Add(this_00);
          local_68 = google::protobuf::internal::InlineGreedyStringParserUTF8Verify
                               (pbVar2,local_68,ctx,"bloaty.Options.data_source");
          if (local_68 == (char *)0x0) goto LAB_0018734b;
        } while ((local_68 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_68 == '\x1a'));
        goto LAB_00186f10;
      }
      break;
    case 4:
      if (cVar5 != ' ') break;
      uVar4 = uVar4 | 0x100;
      uVar3 = google::protobuf::internal::ReadVarint(&local_68);
      this->max_rows_per_level_ = uVar3;
      goto joined_r0x00187296;
    case 5:
      if (cVar5 == '(') {
        uVar3 = google::protobuf::internal::ReadVarint(&local_68);
        this = local_60;
        if (local_68 == (char *)0x0) goto LAB_0018734b;
        if ((Options_Demangle)uVar3 <
            (Options_Demangle_DEMANGLE_NONE|Options_Demangle_DEMANGLE_FULL)) {
          _internal_set_demangle(local_60,(Options_Demangle)uVar3);
        }
        else {
          this_03 = mutable_unknown_fields(local_60);
          number = 5;
LAB_00187314:
          this = local_60;
          google::protobuf::UnknownFieldSet::AddVarint(this_03,number,uVar3);
        }
        goto LAB_00186f10;
      }
      break;
    case 6:
      if (cVar5 == '0') {
        uVar3 = google::protobuf::internal::ReadVarint(&local_68);
        this = local_60;
        if (local_68 == (char *)0x0) goto LAB_0018734b;
        if (Options_SortBy_SORTBY_FILESIZE < (Options_SortBy)uVar3) {
          this_03 = mutable_unknown_fields(local_60);
          number = 6;
          goto LAB_00187314;
        }
        _internal_set_sort_by(local_60,(Options_SortBy)uVar3);
        goto LAB_00186f10;
      }
      break;
    case 7:
      if (cVar5 == '8') {
        uVar4 = uVar4 | 0x10;
        uVar3 = google::protobuf::internal::ReadVarint(&local_68);
        this->verbose_level_ = (int32)uVar3;
        goto joined_r0x00187296;
      }
      break;
    case 8:
      if (cVar5 == 'B') {
        local_68 = local_68 + -1;
        do {
          local_68 = local_68 + 1;
          msg = google::protobuf::RepeatedPtrField<bloaty::CustomDataSource>::Add(local_48);
          local_68 = google::protobuf::internal::ParseContext::
                     ParseMessage<bloaty::CustomDataSource>(ctx,msg,local_68);
          if (local_68 == (char *)0x0) goto LAB_0018734b;
        } while ((local_68 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_68 == 'B'));
        goto LAB_00186f10;
      }
      break;
    case 9:
      if (cVar5 == 'J') {
        s = _internal_mutable_disassemble_function_abi_cxx11_(this);
        field_name = "bloaty.Options.disassemble_function";
LAB_001872c0:
        local_68 = google::protobuf::internal::InlineGreedyStringParserUTF8Verify
                             (s,local_68,ctx,field_name);
        goto joined_r0x00187296;
      }
      break;
    case 10:
      if (cVar5 == 'R') {
        local_68 = local_68 + -1;
        do {
          local_68 = local_68 + 1;
          pbVar2 = google::protobuf::
                   RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::Add(local_40);
          local_68 = google::protobuf::internal::InlineGreedyStringParserUTF8Verify
                               (pbVar2,local_68,ctx,"bloaty.Options.debug_filename");
          if (local_68 == (char *)0x0) goto LAB_0018734b;
        } while ((local_68 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_68 == 'R'));
        goto LAB_00186f10;
      }
      break;
    case 0xb:
      if (cVar5 == 'X') {
        uVar4 = uVar4 | 0x40;
        uVar3 = google::protobuf::internal::ReadVarint(&local_68);
        this->debug_vmaddr_ = uVar3;
        goto joined_r0x00187296;
      }
      break;
    case 0xc:
      if (cVar5 == '`') {
        uVar4 = uVar4 | 0x80;
        uVar3 = google::protobuf::internal::ReadVarint(&local_68);
        this->debug_fileoff_ = uVar3;
        goto joined_r0x00187296;
      }
      break;
    case 0xd:
      if (cVar5 == 'j') {
        s = _internal_mutable_source_filter_abi_cxx11_(this);
        field_name = "bloaty.Options.source_filter";
        goto LAB_001872c0;
      }
      break;
    case 0xe:
      if (cVar5 == 'p') {
        uVar4 = uVar4 | 0x20;
        uVar3 = google::protobuf::internal::ReadVarint(&local_68);
        this->dump_raw_map_ = uVar3 != 0;
        goto joined_r0x00187296;
      }
      break;
    case 0xf:
      if (cVar5 == 'z') {
        local_68 = local_68 + -1;
        do {
          local_68 = local_68 + 1;
          pbVar2 = google::protobuf::
                   RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::Add(local_38);
          local_68 = google::protobuf::internal::InlineGreedyStringParserUTF8Verify
                               (pbVar2,local_68,ctx,"bloaty.Options.source_map");
          if (local_68 == (char *)0x0) goto LAB_0018734b;
        } while ((local_68 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_68 == 'z'));
        goto LAB_00186f10;
      }
    }
    if ((tag == 0) || ((tag & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
      goto LAB_0018732b;
    }
    local_68 = google::protobuf::internal::UnknownFieldParse(tag,local_50,local_68,ctx);
joined_r0x00187296:
    if (local_68 == (char *)0x0) {
LAB_0018734b:
      local_68 = (char *)0x0;
LAB_0018732b:
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar4;
      return local_68;
    }
  } while( true );
}

Assistant:

const char* Options::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated string filename = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_filename(), ptr, ctx, "bloaty.Options.filename");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated string base_filename = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_base_filename(), ptr, ctx, "bloaty.Options.base_filename");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated string data_source = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_data_source(), ptr, ctx, "bloaty.Options.data_source");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      // optional int64 max_rows_per_level = 4 [default = 20];
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          _Internal::set_has_max_rows_per_level(&has_bits);
          max_rows_per_level_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .bloaty.Options.Demangle demangle = 5 [default = DEMANGLE_SHORT];
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(::bloaty::Options_Demangle_IsValid(val))) {
            _internal_set_demangle(static_cast<::bloaty::Options_Demangle>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(5, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional .bloaty.Options.SortBy sort_by = 6 [default = SORTBY_BOTH];
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 48)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(::bloaty::Options_SortBy_IsValid(val))) {
            _internal_set_sort_by(static_cast<::bloaty::Options_SortBy>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(6, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional int32 verbose_level = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 56)) {
          _Internal::set_has_verbose_level(&has_bits);
          verbose_level_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .bloaty.CustomDataSource custom_data_source = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_custom_data_source(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<66>(ptr));
        } else goto handle_unusual;
        continue;
      // optional string disassemble_function = 9;
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 74)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_disassemble_function(), ptr, ctx, "bloaty.Options.disassemble_function");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated string debug_filename = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 82)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_debug_filename(), ptr, ctx, "bloaty.Options.debug_filename");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<82>(ptr));
        } else goto handle_unusual;
        continue;
      // optional uint64 debug_vmaddr = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 88)) {
          _Internal::set_has_debug_vmaddr(&has_bits);
          debug_vmaddr_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint64 debug_fileoff = 12;
      case 12:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 96)) {
          _Internal::set_has_debug_fileoff(&has_bits);
          debug_fileoff_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string source_filter = 13;
      case 13:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 106)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_source_filter(), ptr, ctx, "bloaty.Options.source_filter");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool dump_raw_map = 14;
      case 14:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 112)) {
          _Internal::set_has_dump_raw_map(&has_bits);
          dump_raw_map_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated string source_map = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 122)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_source_map(), ptr, ctx, "bloaty.Options.source_map");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<122>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}